

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

PolymorphicInlineCache * __thiscall
Js::FunctionBody::CreateBiggerPolymorphicInlineCache
          (FunctionBody *this,uint index,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  ushort currentSize;
  uint16 size;
  PolymorphicInlineCache *this_00;
  undefined4 *puVar3;
  PolymorphicInlineCache *clone;
  
  this_00 = GetPolymorphicInlineCache(this,index);
  if ((this_00 == (PolymorphicInlineCache *)0x0) ||
     (currentSize = this_00->size, 0x1f < currentSize)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x192b,
                                "(polymorphicInlineCache && polymorphicInlineCache->CanAllocateBigger())"
                                ,
                                "polymorphicInlineCache && polymorphicInlineCache->CanAllocateBigger()"
                               );
    if (!bVar2) goto LAB_006d3be3;
    *puVar3 = 0;
    currentSize = this_00->size;
  }
  size = PolymorphicInlineCache::GetNextSize(currentSize);
  if (size <= currentSize) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x192e,
                                "(newPolymorphicInlineCacheSize > polymorphicInlineCacheSize)",
                                "newPolymorphicInlineCacheSize > polymorphicInlineCacheSize");
    if (!bVar2) {
LAB_006d3be3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  clone = CreatePolymorphicInlineCache(this,index,size);
  PolymorphicInlineCache::CopyTo
            (this_00,propertyId,
             (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext,clone);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,PolymorphicInlineCachePhase);
  if ((bVar2) && (DAT_0145948a == '\x01')) {
    DumpFullFunctionName(this);
    Output::Print(L": Bigger PIC, index = %d, oldSize = %d, newSize = %d\n",(ulong)index,
                  (ulong)currentSize,(ulong)size);
  }
  return clone;
}

Assistant:

PolymorphicInlineCache * FunctionBody::CreateBiggerPolymorphicInlineCache(uint index, PropertyId propertyId)
    {
        PolymorphicInlineCache * polymorphicInlineCache = GetPolymorphicInlineCache(index);
        Assert(polymorphicInlineCache && polymorphicInlineCache->CanAllocateBigger());
        uint16 polymorphicInlineCacheSize = polymorphicInlineCache->GetSize();
        uint16 newPolymorphicInlineCacheSize = PolymorphicInlineCache::GetNextSize(polymorphicInlineCacheSize);
        Assert(newPolymorphicInlineCacheSize > polymorphicInlineCacheSize);
        PolymorphicInlineCache * newPolymorphicInlineCache = CreatePolymorphicInlineCache(index, newPolymorphicInlineCacheSize);
        polymorphicInlineCache->CopyTo(propertyId, m_scriptContext, newPolymorphicInlineCache);
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (PHASE_VERBOSE_TRACE1(Js::PolymorphicInlineCachePhase))
        {
            this->DumpFullFunctionName();
            Output::Print(_u(": Bigger PIC, index = %d, oldSize = %d, newSize = %d\n"), index, polymorphicInlineCacheSize, newPolymorphicInlineCacheSize);
        }
#endif
#if PHASE_PRINT_INTRUSIVE_TESTTRACE1
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
        PHASE_PRINT_INTRUSIVE_TESTTRACE1(
            Js::PolymorphicInlineCachePhase,
            _u("TestTrace PIC:  Bigger, Function %s (%s), 0x%x, index = %d, size = %d\n"), this->GetDisplayName(), this->GetDebugNumberSet(debugStringBuffer), newPolymorphicInlineCache, index, newPolymorphicInlineCacheSize);
        return newPolymorphicInlineCache;
    }